

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * ApprovalTests::ApprovalTestNamer::getMisconfiguredMainHelp_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_48 [32];
  string local_28 [40];
  
  __lhs = in_RDI;
  HelpMessages::getMisconfiguredMainHelp_abi_cxx11_();
  ::std::operator+((char *)__lhs,in_RDI);
  ::std::operator+(__lhs,(char *)in_RDI);
  ::std::__cxx11::string::~string(local_28);
  ::std::__cxx11::string::~string(local_48);
  return __lhs;
}

Assistant:

std::string ApprovalTestNamer::getMisconfiguredMainHelp()
    {
        return "\n\n" + HelpMessages::getMisconfiguredMainHelp() + "\n\n";
    }